

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

ImFont ** ImVector_ImFontPtr_insert(ImVector_ImFontPtr *self,ImFont **it,ImFont *v)

{
  int iVar1;
  int iVar2;
  ImFont **ppIVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  ppIVar3 = self->Data;
  if ((ppIVar3 <= it) && (iVar1 = self->Size, it <= ppIVar3 + iVar1)) {
    lVar6 = (long)it - (long)ppIVar3;
    iVar2 = self->Capacity;
    if (iVar1 == iVar2) {
      if (iVar2 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar2 / 2 + iVar2;
      }
      iVar7 = iVar1 + 1;
      if (iVar1 + 1 < iVar4) {
        iVar7 = iVar4;
      }
      if (iVar2 < iVar7) {
        ppIVar3 = (ImFont **)ImGui::MemAlloc((long)iVar7 << 3);
        if (self->Data != (ImFont **)0x0) {
          memcpy(ppIVar3,self->Data,(long)self->Size << 3);
          ImGui::MemFree(self->Data);
        }
        self->Data = ppIVar3;
        self->Capacity = iVar7;
      }
    }
    lVar5 = (long)self->Size - (lVar6 >> 3);
    if (lVar5 != 0 && lVar6 >> 3 <= (long)self->Size) {
      memmove((void *)((long)self->Data + lVar6 + 8),(void *)((long)self->Data + lVar6),lVar5 * 8);
    }
    *(ImFont **)((long)self->Data + lVar6) = v;
    self->Size = self->Size + 1;
    return (ImFont **)(lVar6 + (long)self->Data);
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f2,"T *ImVector<ImFont *>::insert(const T *, const T &) [T = ImFont *]");
}

Assistant:

CIMGUI_API int igGetFrameCount()
{
    return ImGui::GetFrameCount();
}